

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoTestOld(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  uint local_30;
  abctime clk;
  Vec_Ptr_t *vEquivs;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  vEquivs._4_4_ = fVerbose;
  pGStack_10 = p;
  aVar4 = Abc_Clock();
  clk = (abctime)Gia_IsoDeriveEquivPos(pGStack_10,0,vEquivs._4_4_);
  uVar1 = Gia_ManPoNum(pGStack_10);
  if (clk == 0) {
    local_30 = 1;
  }
  else {
    local_30 = Vec_PtrSize((Vec_Ptr_t *)clk);
  }
  printf("Reduced %d outputs to %d.  ",(ulong)uVar1,(ulong)local_30);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar4);
  if ((vEquivs._4_4_ != 0) && (clk != 0)) {
    iVar2 = Gia_ManPoNum(pGStack_10);
    iVar3 = Vec_PtrSize((Vec_Ptr_t *)clk);
    if (iVar2 != iVar3) {
      printf("Nontrivial classes:\n");
    }
  }
  Vec_VecFreeP((Vec_Vec_t **)&clk);
  return;
}

Assistant:

void Gia_IsoTestOld( Gia_Man_t * p, int fVerbose )
{
    Vec_Ptr_t * vEquivs;
    abctime clk = Abc_Clock(); 
    vEquivs = Gia_IsoDeriveEquivPos( p, 0, fVerbose );
    printf( "Reduced %d outputs to %d.  ", Gia_ManPoNum(p), vEquivs ? Vec_PtrSize(vEquivs) : 1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && vEquivs && Gia_ManPoNum(p) != Vec_PtrSize(vEquivs) )
    {
        printf( "Nontrivial classes:\n" );
//        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    Vec_VecFreeP( (Vec_Vec_t **)&vEquivs );
}